

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::WriteLine
                    (Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  bool bVar1;
  const_reference var;
  Parameters *params_local;
  ScriptPtr *param_0_local;
  
  bVar1 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::empty(params);
  if (!bVar1) {
    var = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[](params,0);
    DebugWriteInternal(Info,var);
  }
  LogWrite(Info,"\n");
  Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant WriteLine(ScriptPtr, const Parameters & params)
	{
		if (!params.empty())
			DebugWriteInternal(LogLevel::Info, params[0]);
		LogWrite(LogLevel::Info, "\n");
		return nullptr;
	}